

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  VPUMemLinear_t *pVVar1;
  char cVar2;
  RK_U32 RVar3;
  RK_U32 RVar4;
  OMX_RK_VIDEO_CODINGTYPE OVar5;
  RK_U8 RVar6;
  int iVar7;
  RK_S32 RVar8;
  uint uVar9;
  RK_S32 RVar10;
  char *pcVar11;
  size_t sVar12;
  FILE *pFVar13;
  FILE *pFVar14;
  ulong uVar15;
  VpuCodecContext_t *pVVar16;
  undefined8 *puVar17;
  RK_U8 *pRVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  RK_U8 *pRVar23;
  bool bVar24;
  undefined8 uVar25;
  undefined1 auVar26 [16];
  RK_S32 pkt_size;
  uint local_25c;
  undefined1 local_258 [16];
  DecoderOut_t decOut;
  VideoPacket_t local_228;
  long local_1f8;
  RK_U8 *local_1f0;
  VpuApiDemoCmdContext_t demoCmdCtx;
  long lVar22;
  
  puts("/*******  vpu api demo in *******/");
  if (argc != 1) {
    vpuapi_hdl = (void *)dlopen("libvpu.so",0x101);
    if (vpuapi_hdl == (void *)0x0) {
      puts("failed to open libvpu.so");
LAB_001013cf:
      uVar9 = 0xffffffff;
    }
    else {
      vpuapi_open_ctx =
           (_func_RK_S32_VpuCodecContext_t_ptr_ptr *)dlsym(vpuapi_hdl,"vpu_open_context");
      vpuapi_close_ctx =
           (_func_RK_S32_VpuCodecContext_t_ptr_ptr *)dlsym(vpuapi_hdl,"vpu_close_context");
      vpuapi_mem_link = (_func_RK_S32_VPUMemLinear_t_ptr *)dlsym(vpuapi_hdl,"VPUMemLink");
      vpuapi_mem_free = (_func_RK_S32_VPUMemLinear_t_ptr *)dlsym(vpuapi_hdl,"VPUFreeLinear");
      auVar26._0_4_ =
           -(uint)((int)((ulong)vpuapi_open_ctx >> 0x20) == 0 && (int)vpuapi_open_ctx == 0);
      auVar26._4_4_ =
           -(uint)((int)vpuapi_close_ctx == 0 && (int)((ulong)vpuapi_close_ctx >> 0x20) == 0);
      auVar26._8_4_ =
           -(uint)((int)((ulong)vpuapi_mem_link >> 0x20) == 0 && (int)vpuapi_mem_link == 0);
      auVar26._12_4_ =
           -(uint)((int)vpuapi_mem_free == 0 && (int)((ulong)vpuapi_mem_free >> 0x20) == 0);
      iVar7 = movmskps((int)vpuapi_mem_free,auVar26);
      if (iVar7 != 0) {
        printf("failed to open vpu_open_context %p vpu_close_context %p\n",vpuapi_open_ctx,
               vpuapi_close_ctx);
        printf("failed to open VPUMemLink %p VPUFreeLinear %p\n",vpuapi_mem_link,vpuapi_mem_free);
        goto LAB_001013cf;
      }
      printf("get vpuapi handle %p vpu_open_context %p vpu_close_context %p\n");
      memset(&demoCmdCtx,0,0x1b0);
      demoCmdCtx.codec_type = CODEC_DECODER;
      if (1 < argc) {
        lVar21 = 1;
        bVar24 = false;
LAB_0010147c:
        lVar21 = (long)(int)lVar21;
LAB_0010147f:
        do {
          lVar22 = lVar21;
          RVar6 = demoCmdCtx.have_input;
          OVar5 = demoCmdCtx.coding;
          RVar4 = demoCmdCtx.height;
          RVar3 = demoCmdCtx.width;
          lVar21 = lVar22 + 1;
          if ((long)(ulong)(uint)argc <= lVar22) {
            if (demoCmdCtx.codec_type != CODEC_ENCODER) {
              uVar9 = 0xffffff9b;
              if (demoCmdCtx.codec_type != CODEC_DECODER) goto LAB_001013d3;
              pkt_size = 0;
              local_25c = 0;
              if (((demoCmdCtx.coding < OMX_RK_VIDEO_CodingMPEG2 || demoCmdCtx.height == 0) ||
                   (demoCmdCtx.width == 0 || demoCmdCtx.have_input == '\0')) &&
                 (puts("Warning: missing needed parameters for vpu api demo"), RVar6 == '\0')) {
                pcVar11 = "please set input bitstream file";
LAB_00101b60:
                puts(pcVar11);
                pFVar13 = (FILE *)0x0;
              }
              else {
                printf("input bitstream w: %d, h: %d, coding: %d(%s), path: %s\n",(ulong)RVar3,
                       (ulong)RVar4,(ulong)OVar5,"decode",demoCmdCtx.input_file);
                pFVar13 = fopen(demoCmdCtx.input_file,"rb");
                if (pFVar13 == (FILE *)0x0) {
                  pcVar11 = "input file not exsist";
                  goto LAB_00101b60;
                }
                if (demoCmdCtx.have_output == '\0') {
                  pFVar14 = (FILE *)0x0;
LAB_001018f0:
                  pRVar18 = (RK_U8 *)0x0;
                  fseek(pFVar13,0,2);
                  uVar15 = ftell(pFVar13);
                  fseek(pFVar13,0,0);
                  local_228.data = (RK_U8 *)0x0;
                  local_228.size = 0;
                  local_228.capability = 0;
                  local_228.nFlags = 0;
                  local_228._36_4_ = 0;
                  local_228.pts = -0x8000000000000000;
                  local_228.dts = 0x8000000000000000;
                  decOut.data = (RK_U8 *)0x0;
                  decOut.size = 0;
                  decOut._12_4_ = 0;
                  decOut.timeUs = 0;
                  decOut.nFlags = 0;
                  decOut._28_4_ = 0;
                  RVar8 = (*vpuapi_open_ctx)(&ctx);
                  if ((RVar8 == 0) && (ctx != (VpuCodecContext_t *)0x0)) {
                    RVar8 = readBytesFromFile((RK_U8 *)&local_25c,4,(FILE *)pFVar13);
                    uVar9 = 0xffffff99;
                    if (RVar8 == 0) {
                      printf("codec extra data size: %d\n",(ulong)local_25c);
                      uVar19 = local_25c;
                      pRVar18 = (RK_U8 *)calloc(1,(ulong)local_25c);
                      if (pRVar18 != (RK_U8 *)0x0) {
                        local_258._0_8_ = pRVar18;
                        RVar8 = readBytesFromFile(pRVar18,uVar19,(FILE *)pFVar13);
                        pVVar16 = ctx;
                        if (RVar8 != 0) {
                          bVar24 = false;
                          goto LAB_00101d37;
                        }
                        ctx->codecType = demoCmdCtx.codec_type;
                        pVVar16->videoCoding = demoCmdCtx.height;
                        pVVar16->width = demoCmdCtx.width;
                        pVVar16->height = demoCmdCtx.height;
                        pVVar16->no_thread = 1;
                        pRVar18 = (RK_U8 *)local_258._0_8_;
                        uVar9 = (*pVVar16->init)(pVVar16,(RK_U8 *)local_258._0_8_,local_25c);
                        if (uVar9 != 0) {
                          printf("init vpu api context fail, ret: 0x%X\n",(ulong)uVar9);
                          uVar9 = 0xffffff97;
                          goto LAB_0010198b;
                        }
                        printf("init vpu api context ok, fileSize: %d\n",uVar15 & 0xffffffff);
                        local_1f8 = (long)(int)uVar15;
                        uVar9 = 0;
                        local_1f0 = (RK_U8 *)0x0;
                        goto LAB_00102086;
                      }
                      uVar9 = 0xffffff98;
                    }
                    bVar24 = false;
                    pRVar18 = (RK_U8 *)0x0;
                    goto LAB_0010198d;
                  }
                  uVar9 = 0xffffff98;
LAB_0010198b:
                  bVar24 = false;
                  goto LAB_0010198d;
                }
                printf("vpu api demo output file: %s\n",demoCmdCtx.output_file);
                pFVar14 = fopen(demoCmdCtx.output_file,"wb");
                if (pFVar14 != (FILE *)0x0) {
                  if (demoCmdCtx.record_frames == 0) {
                    demoCmdCtx.record_frames = 5;
                  }
                  goto LAB_001018f0;
                }
                puts("can not write output file");
              }
              uVar9 = 0xffffff9b;
              pFVar14 = (FILE *)0x0;
              bVar24 = false;
              pRVar18 = (RK_U8 *)0x0;
              goto LAB_00101b74;
            }
            pkt_size = 0;
            if (((demoCmdCtx.coding < OMX_RK_VIDEO_CodingMPEG2 || demoCmdCtx.height == 0) ||
                 (demoCmdCtx.width == 0 || demoCmdCtx.have_input == '\0')) &&
               (puts("Warning: missing needed parameters for vpu api demo"), RVar6 == '\0')) {
              pcVar11 = "please set input bitstream file";
            }
            else {
              printf("input bitstream w: %d, h: %d, coding: %d(%s), path: %s\n",(ulong)RVar3,
                     (ulong)RVar4,(ulong)OVar5,"encode",demoCmdCtx.input_file);
              pFVar13 = fopen(demoCmdCtx.input_file,"rb");
              if (pFVar13 != (FILE *)0x0) {
                if (demoCmdCtx.have_output == '\0') {
                  pFVar14 = (FILE *)0x0;
                }
                else {
                  printf("vpu api demo output file: %s\n",demoCmdCtx.output_file);
                  pFVar14 = fopen(demoCmdCtx.output_file,"wb");
                  if (pFVar14 == (FILE *)0x0) {
                    puts("can not write output file");
                    uVar9 = 0xffffff9b;
                    pFVar14 = (FILE *)0x0;
                    goto LAB_00101bf0;
                  }
                }
                pVVar16 = (VpuCodecContext_t *)calloc(1,0xe0);
                ctx = pVVar16;
                if (pVVar16 == (VpuCodecContext_t *)0x0) {
                  printf("Input context has not been properly allocated");
                  uVar9 = 0xffffffff;
                  goto LAB_00101c89;
                }
                pVVar16->codecType = CODEC_ENCODER;
                pVVar16->videoCoding = OMX_RK_VIDEO_CodingAVC;
                pVVar16->width = demoCmdCtx.width;
                pVVar16->height = demoCmdCtx.height;
                fseek(pFVar13,0,2);
                uVar15 = ftell(pFVar13);
                fseek(pFVar13,0,0);
                local_228.pts = 0;
                local_228.dts = 0;
                local_228.nFlags = 0;
                local_228._36_4_ = 0;
                local_228.data = (RK_U8 *)0x0;
                local_228.size = 0;
                local_228.capability = 0;
                decOut.nFlags = 0;
                decOut._28_4_ = 0;
                decOut.size = 0;
                decOut._12_4_ = 0;
                decOut.timeUs = 0;
                decOut.data = (RK_U8 *)malloc((ulong)(demoCmdCtx.height * demoCmdCtx.width));
                uVar9 = 0xffffff98;
                if ((decOut.data == (RK_U8 *)0x0) ||
                   (RVar8 = (*vpuapi_open_ctx)(&ctx), pVVar16 = ctx,
                   ctx == (VpuCodecContext_t *)0x0 || RVar8 != 0)) goto LAB_00101b23;
                local_258._4_4_ = demoCmdCtx.height;
                local_258._0_4_ = demoCmdCtx.width;
                local_258._8_4_ = demoCmdCtx.codec_type;
                local_258._12_4_ = demoCmdCtx.coding;
                uVar25 = local_258._8_8_;
                pVVar16->codecType = (int)uVar25;
                pVVar16->videoCoding = (int)((ulong)uVar25 >> 0x20);
                pVVar16->width = demoCmdCtx.width;
                pVVar16->height = demoCmdCtx.height;
                pVVar16->no_thread = 1;
                puVar17 = (undefined8 *)calloc(1,0x40);
                pVVar16->private_data = puVar17;
                *puVar17 = local_258._0_8_;
                puVar17[1] = 0x3d090000000000;
                *(undefined4 *)(puVar17 + 2) = 0x19;
                puVar17[3] = 1;
                puVar17[4] = 0x1e00000000;
                *(undefined8 *)((long)puVar17 + 0x2c) = 0x2800000064;
                uVar9 = (*pVVar16->init)(pVVar16,(RK_U8 *)0x0,0);
                if (uVar9 != 0) {
                  printf("init vpu api context fail, ret: 0x%X\n",(ulong)uVar9);
                  uVar9 = 0xffffff97;
                  goto LAB_00101b23;
                }
                printf("encode init ok, sps len: %d\n",(ulong)(uint)ctx->extradata_size);
                if ((pFVar14 != (FILE *)0x0) && (0 < ctx->extradata_size)) {
                  printf("dump %d bytes enc output stream to file\n");
                  fwrite(ctx->extradata,1,(long)ctx->extradata_size,pFVar14);
                  fflush(pFVar14);
                }
                uVar9 = (*ctx->control)(ctx,VPU_API_ENC_SETFORMAT,&pkt_size);
                if (uVar9 != 0) {
                  printf("VPU_API_ENC_SETFORMAT ret %d\n",(ulong)uVar9);
                }
                uVar9 = (*ctx->control)(ctx,VPU_API_ENC_GETCFG,puVar17);
                if (uVar9 != 0) {
                  printf("VPU_API_ENC_GETCFG ret %d\n",(ulong)uVar9);
                }
                *(undefined4 *)(puVar17 + 1) = 1;
                uVar9 = (*ctx->control)(ctx,VPU_API_ENC_SETCFG,puVar17);
                if (uVar9 != 0) {
                  printf("VPU_API_ENC_SETCFG ret %d\n",(ulong)uVar9);
                }
                printf("init vpu api context ok, input yuv stream file size: %d\n",
                       uVar15 & 0xffffffff);
                uVar19 = (ctx->width + 0xf & 0xfffffff0) * (ctx->height + 0xf & 0xfffffff0) * 3 >> 1
                ;
                local_258._0_4_ = ctx->width * ctx->height * 3 >> 1;
                printf("%d %d %d %d %d");
                pRVar18 = (RK_U8 *)0x0;
                goto LAB_00101ec3;
              }
              pcVar11 = "input file not exsist";
            }
            puts(pcVar11);
            uVar9 = 0xffffff9b;
            pFVar14 = (FILE *)0x0;
            pFVar13 = (FILE *)0x0;
            goto LAB_00101bf0;
          }
        } while (((bVar24) || (pcVar11 = argv[lVar22], *pcVar11 != '-')) ||
                (cVar2 = pcVar11[1], cVar2 == '\0'));
        if (cVar2 == '-') {
          cVar2 = pcVar11[2];
          if (cVar2 == '\0') goto LAB_001016a9;
          pcVar11 = pcVar11 + 1;
        }
        __s1 = pcVar11 + 1;
        if (cVar2 == 'h') {
          if ((pcVar11[2] != '\0') && (iVar7 = strncmp(__s1,"help",4), iVar7 == 0)) {
            puts("usage: vpu_apiDemo [opt] input_file, \n");
            for (lVar21 = 0x10; lVar21 != 0xd0; lVar21 = lVar21 + 0x18) {
              printf("-%s  %-16s\t%s\n",
                     *(undefined8 *)((long)&__frame_dummy_init_array_entry + lVar21),
                     *(undefined8 *)((long)&__do_global_dtors_aux_fini_array_entry + lVar21),
                     *(undefined8 *)((long)&vpuApiCmd[0].name + lVar21));
            }
            return 0;
          }
          if (argv[lVar21] != (char *)0x0) {
            demoCmdCtx.height = atoi(argv[lVar21]);
            goto LAB_0010147f;
          }
          pcVar11 = "input height is invalid";
        }
        else if (cVar2 == 'w') {
          if (argv[lVar21] != (char *)0x0) {
            demoCmdCtx.width = atoi(argv[lVar21]);
            goto LAB_0010147f;
          }
          pcVar11 = "input width is invalid";
        }
        else if (cVar2 == 'o') {
          pcVar11 = argv[lVar21];
          if (pcVar11 != (char *)0x0) {
            sVar12 = strlen(pcVar11);
            memcpy(demoCmdCtx.output_file,pcVar11,sVar12);
            demoCmdCtx.output_file[sVar12] = '\0';
            demoCmdCtx.have_output = '\x01';
            goto LAB_0010147f;
          }
          pcVar11 = "out file is invalid";
        }
        else if (cVar2 == 't') {
          if (argv[lVar21] != (char *)0x0) {
            demoCmdCtx.codec_type = atoi(argv[lVar21]);
            goto LAB_0010147f;
          }
          pcVar11 = "input codec_type is invalid";
        }
        else {
          if (cVar2 != 'i') {
            if ((pcVar11[2] == '\0') || (argv[lVar21] == (char *)0x0)) goto LAB_0010144a;
            local_1f8 = CONCAT71(local_1f8._1_7_,pcVar11[2]);
            local_258._0_8_ = argv[lVar21];
            iVar7 = strncmp(__s1,"coding",6);
            if (iVar7 == 0) {
              printf("coding, argv[optindex]: %s",local_258._0_8_);
              demoCmdCtx.coding = atoi(argv[lVar21]);
            }
            else {
              iVar7 = strncmp(__s1,"vframes",7);
              if (iVar7 == 0) {
                demoCmdCtx.record_frames = atoi((char *)local_258._0_8_);
              }
              else {
                if ((cVar2 != 's') || ((char)local_1f8 != 's')) goto LAB_0010144a;
                iVar7 = atoi((char *)local_258._0_8_);
                demoCmdCtx.record_start_ms = (RK_S64)iVar7;
              }
            }
            goto LAB_0010147f;
          }
          pcVar11 = argv[lVar21];
          if (pcVar11 != (char *)0x0) {
            sVar12 = strlen(pcVar11);
            memcpy(demoCmdCtx.input_file,pcVar11,sVar12);
            demoCmdCtx.input_file[sVar12] = '\0';
            demoCmdCtx.have_input = '\x01';
            goto LAB_0010147f;
          }
          pcVar11 = "input file is invalid";
        }
        puts(pcVar11);
      }
LAB_0010144a:
      puts("vpu api demo, input parameter invalid");
      show_usage();
      puts("parse_options fail\n");
      show_usage();
      uVar9 = 0xffffff9b;
    }
    goto LAB_001013d3;
  }
  show_usage();
  goto LAB_001012b8;
LAB_00102086:
  lVar21 = ftell(pFVar13);
  if (local_1f8 <= lVar21) {
    puts("read end of file, complete");
    uVar9 = 0;
    bVar24 = true;
    goto LAB_0010198d;
  }
  if (local_228.size != 0) {
LAB_00102174:
    decOut._8_8_ = decOut._8_8_ & 0xffffffff00000000;
    RVar8 = (*ctx->decode_sendstream)(ctx,&local_228);
    if (RVar8 == 0) {
      RVar8 = (*ctx->decode_getframe)(ctx,&decOut);
      if (RVar8 == 0) goto code_r0x001021ad;
      puts("get decoded data failed");
      uVar9 = 0xffffff42;
      bVar24 = false;
    }
    else {
      bVar24 = false;
      printf("send packet failed");
      uVar9 = 0xffffff42;
    }
    goto LAB_0010198d;
  }
  RVar10 = readBytesFromFile((RK_U8 *)&pkt_size,4,(FILE *)pFVar13);
  RVar8 = pkt_size;
  bVar24 = true;
  if (RVar10 != 0) goto LAB_0010229d;
  if (local_228.data == (RK_U8 *)0x0) {
    local_228.data = (RK_U8 *)malloc((long)pkt_size);
joined_r0x0010210c:
    if (local_228.data == (RK_U8 *)0x0) {
      bVar24 = false;
      uVar9 = 0xffffff98;
      pRVar18 = (RK_U8 *)local_258._0_8_;
      goto LAB_001019a2;
    }
    local_228.capability = RVar8;
  }
  else if (local_228.capability < (uint)pkt_size) {
    local_228.data = (RK_U8 *)realloc(local_228.data,(long)pkt_size);
    RVar8 = pkt_size;
    goto joined_r0x0010210c;
  }
  RVar10 = readBytesFromFile(local_228.data,RVar8,(FILE *)pFVar13);
  pRVar18 = local_1f0;
  RVar8 = pkt_size;
  if (RVar10 == 0) {
    local_228.size = pkt_size;
    local_228.pts = (RK_S64)local_1f0;
    pRVar23 = local_1f0 + 40000;
    lVar21 = ftell(pFVar13);
    printf("read one packet, size: %d, pts: %lld, filePos: %ld\n",(ulong)(uint)RVar8,pRVar18,lVar21)
    ;
    pRVar18 = (RK_U8 *)local_258._0_8_;
    local_1f0 = pRVar23;
    goto LAB_00102174;
  }
  uVar9 = 0;
LAB_00101d37:
  pRVar18 = (RK_U8 *)local_258._0_8_;
  goto LAB_0010198d;
code_r0x001021ad:
  printf("vpu decode one frame, out len: %d, left size: %d\n",decOut._8_8_ & 0xffffffff,
         local_228._24_8_ & 0xffffffff);
  pRVar23 = decOut.data;
  if ((decOut.size != 0) && (decOut.data != (RK_U8 *)0x0)) {
    pVVar1 = (VPUMemLinear_t *)(decOut.data + 0x40);
    (*vpuapi_mem_link)(pVVar1);
    if ((pFVar14 != (FILE *)0x0) &&
       (uVar19 = uVar9 + 1, bVar24 = uVar9 < demoCmdCtx.record_frames, uVar9 = uVar19, bVar24)) {
      uVar20 = (*(int *)(pRVar23 + 0x1c) + 0xfU & 0xfffffff0) *
               (*(int *)(pRVar23 + 0x18) + 0xfU & 0xffffff0) * 3 >> 1;
      printf("write %d frame(yuv420sp) data, %d bytes to file\n",(ulong)uVar19,(ulong)uVar20);
      pRVar18 = (RK_U8 *)local_258._0_8_;
      fwrite(*(void **)(pRVar23 + 0x48),1,(ulong)uVar20,pFVar14);
      fflush(pFVar14);
    }
    (*vpuapi_mem_free)(pVVar1);
    free(decOut.data);
    decOut.data = (RK_U8 *)0x0;
    decOut._8_8_ = decOut._8_8_ & 0xffffffff00000000;
  }
  usleep(3000);
  if (ctx->decoder_err != 0) goto LAB_0010229d;
  goto LAB_00102086;
LAB_0010229d:
  bVar24 = true;
  uVar9 = 0;
LAB_0010198d:
  if (local_228.data != (RK_U8 *)0x0) {
    free(local_228.data);
    local_228.data = (RK_U8 *)0x0;
  }
LAB_001019a2:
  if (decOut.data != (RK_U8 *)0x0) {
    free(decOut.data);
    decOut.data = (RK_U8 *)0x0;
  }
LAB_00101b74:
  free(pRVar18);
  if (ctx != (VpuCodecContext_t *)0x0) {
    (*vpuapi_close_ctx)(&ctx);
    ctx = (VpuCodecContext_t *)0x0;
  }
  if (pFVar13 != (FILE *)0x0) {
    fclose(pFVar13);
  }
  if (pFVar14 != (FILE *)0x0) {
    fclose(pFVar14);
  }
  if (!bVar24) {
    pcVar11 = "decode demo fail, err: %d\n";
    goto LAB_00101c5a;
  }
  puts("encode demo complete OK.");
  goto LAB_00101c89;
LAB_00101ec3:
  lVar21 = ftell(pFVar13);
  if ((int)uVar15 <= lVar21) goto LAB_00102047;
  pRVar23 = pRVar18;
  if ((int)local_228.dts == 0) {
    if ((RK_U8 *)local_228.pts == (RK_U8 *)0x0) {
      local_228.pts = (RK_S64)malloc((ulong)uVar19);
LAB_00101f05:
      if ((RK_U8 *)local_228.pts == (RK_U8 *)0x0) {
        uVar9 = 0xffffff98;
        goto LAB_00101b38;
      }
      local_228.nFlags = uVar19;
    }
    else if (local_228.nFlags < uVar19) {
      local_228.pts = (RK_S64)realloc((void *)local_228.pts,(ulong)uVar19);
      goto LAB_00101f05;
    }
    RVar8 = readBytesFromFile((RK_U8 *)local_228.pts,local_258._0_4_,(FILE *)pFVar13);
    if (RVar8 != 0) goto LAB_00101b23;
    local_228.dts = CONCAT44(local_228.dts._4_4_,uVar19);
    pRVar23 = pRVar18 + 40000;
    local_228.data = pRVar18;
    lVar21 = ftell(pFVar13);
    printf("read one frame, size: %d, timeUs: %lld, filePos: %ld\n",(ulong)uVar19,pRVar18,lVar21);
  }
  uVar9 = (*ctx->encode)(ctx,(EncInputStream_t *)&local_228,(EncoderOut_t *)&decOut);
  if ((int)uVar9 < 0) {
    uVar9 = 0xffffff42;
    goto LAB_00101b23;
  }
  local_228.dts = local_228.dts & 0xffffffff00000000;
  printf("vpu encode one frame, out len: %d, left size: %d\n",decOut._8_8_ & 0xffffffff,0);
  if ((decOut.size != 0) && (decOut.data != (RK_U8 *)0x0)) {
    if (pFVar14 != (FILE *)0x0) {
      printf("dump %d bytes enc output stream to file\n");
      fwrite(decOut.data,1,(long)(int)decOut.size,pFVar14);
      fflush(pFVar14);
    }
    decOut._8_8_ = decOut._8_8_ & 0xffffffff00000000;
  }
  usleep(3000);
  pRVar18 = pRVar23;
  goto LAB_00101ec3;
LAB_001016a9:
  bVar24 = true;
  goto LAB_0010147c;
LAB_00102047:
  puts("read end of file, complete");
LAB_00101b23:
  if ((RK_U8 *)local_228.pts != (RK_U8 *)0x0) {
    free((void *)local_228.pts);
    local_228.pts = 0;
  }
LAB_00101b38:
  if (decOut.data != (RK_U8 *)0x0) {
    free(decOut.data);
    decOut.data = (RK_U8 *)0x0;
  }
LAB_00101bf0:
  if (ctx != (VpuCodecContext_t *)0x0) {
    if (ctx->private_data != (void *)0x0) {
      free(ctx->private_data);
      ctx->private_data = (void *)0x0;
    }
    (*vpuapi_close_ctx)(&ctx);
    ctx = (VpuCodecContext_t *)0x0;
  }
  if (pFVar13 != (FILE *)0x0) {
    fclose(pFVar13);
  }
  if (pFVar14 != (FILE *)0x0) {
    fclose(pFVar14);
  }
  if (uVar9 == 0) {
    puts("encode demo complete OK.");
    uVar9 = 0;
  }
  else {
    pcVar11 = "encode demo fail, err: %d\n";
LAB_00101c5a:
    printf(pcVar11,(ulong)uVar9);
  }
LAB_00101c89:
  if (uVar9 == 0) {
    puts("vpu api demo complete OK.");
LAB_001012b8:
    uVar9 = 0;
  }
  else {
LAB_001013d3:
    printf("vpu api demo fail, err: %d\n",(ulong)uVar9);
    if (vpuapi_hdl != (void *)0x0) {
      dlclose();
      vpuapi_hdl = (void *)0x0;
    }
  }
  return uVar9;
}

Assistant:

int main(int argc, char **argv)
{
    RK_S32 ret = 0;
    VpuApiDemoCmdContext_t demoCmdCtx;
    VpuApiDemoCmdContext_t *cmd = NULL;

    printf("/*******  vpu api demo in *******/\n");
    if (argc == 1) {
        show_usage();
        return 0;
    }

    /* open library for access */
    vpuapi_hdl = dlopen("libvpu.so", RTLD_LAZY | RTLD_GLOBAL);
    if (NULL == vpuapi_hdl) {
        printf("failed to open libvpu.so\n");
        ret = -1;
        goto DEMO_OUT;
    }

    vpuapi_open_ctx = (RK_S32 (*)(VpuCodecContext_t **ctx))dlsym(vpuapi_hdl, "vpu_open_context");
    vpuapi_close_ctx = (RK_S32 (*)(VpuCodecContext_t **ctx))dlsym(vpuapi_hdl, "vpu_close_context");
    vpuapi_mem_link = (RK_S32 (*)(VPUMemLinear_t * p))dlsym(vpuapi_hdl, "VPUMemLink");
    vpuapi_mem_free = (RK_S32 (*)(VPUMemLinear_t * p))dlsym(vpuapi_hdl, "VPUFreeLinear");

    if (NULL == vpuapi_open_ctx || NULL == vpuapi_close_ctx ||
        NULL == vpuapi_mem_link || NULL == vpuapi_mem_free) {
        printf("failed to open vpu_open_context %p vpu_close_context %p\n",
               vpuapi_open_ctx, vpuapi_close_ctx);
        printf("failed to open VPUMemLink %p VPUFreeLinear %p\n",
               vpuapi_mem_link, vpuapi_mem_free);
        ret = -1;
        goto DEMO_OUT;
    }

    printf("get vpuapi handle %p vpu_open_context %p vpu_close_context %p\n",
           vpuapi_hdl, vpuapi_open_ctx, vpuapi_close_ctx);

    cmd = &demoCmdCtx;
    memset(cmd, 0, sizeof(VpuApiDemoCmdContext_t));
    cmd->codec_type = CODEC_DECODER;
    if ((ret = parse_options(argc, argv, cmd)) != 0) {
        if (ret == VPU_DEMO_PARSE_HELP_OK) {
            return 0;
        }

        printf("parse_options fail\n\n");
        show_usage();
        DEMO_ERR_RET(ERROR_INVALID_PARAM);
    }

    switch (cmd->codec_type) {
    case CODEC_DECODER : {
        ret = vpu_decode_demo(cmd);
    } break;
    case CODEC_ENCODER : {
        ret = vpu_encode_demo(cmd);
    } break;
    default : {
        ret = ERROR_INVALID_PARAM;
    } break;
    }

DEMO_OUT:
    if (ret) {
        printf("vpu api demo fail, err: %d\n", ret);
        if (vpuapi_hdl) {
            dlclose(vpuapi_hdl);
            vpuapi_hdl = NULL;
        }
    } else {
        printf("vpu api demo complete OK.\n");
    }
    return ret;
}